

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O3

RK_S32 mpi_enc_opt_fqc(void *ctx,char *next)

{
  int iVar1;
  
  if ((next != (char *)0x0) &&
     (iVar1 = __isoc99_sscanf(next,"%d:%d:%d:%d",(long)ctx + 0x84,(long)ctx + 0x8c,(long)ctx + 0x88,
                              (long)ctx + 0x90), iVar1 != 0)) {
    return 1;
  }
  _mpp_log_l(2,"mpi_enc_utils","invalid frame quality control usage -fqc min_i:max_i:min_p:max_p\n",
             0);
  return 0;
}

Assistant:

RK_S32 mpi_enc_opt_fqc(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;
    RK_S32 cnt = 0;

    if (next) {
        cnt = sscanf(next, "%d:%d:%d:%d", &cmd->fqp_min_i, &cmd->fqp_max_i,
                     &cmd->fqp_min_p, &cmd->fqp_max_p);
        if (cnt)
            return 1;
    }

    mpp_err("invalid frame quality control usage -fqc min_i:max_i:min_p:max_p\n");
    return 0;
}